

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int evfilt_timer_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  knote *kn;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  uint *in_R8;
  ssize_t n;
  uint64_t expired;
  epoll_event *ev;
  filter *in_stack_ffffffffffffffc0;
  int local_4;
  
  *in_RDI = *in_RCX;
  in_RDI[1] = in_RCX[1];
  in_RDI[2] = in_RCX[2];
  in_RDI[3] = in_RCX[3];
  if ((*in_R8 & 8) != 0) {
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
  }
  kn = (knote *)read(*(int *)(in_RCX + 0x10),&stack0xffffffffffffffc0,8);
  if (kn != (knote *)0x8) {
    in_stack_ffffffffffffffc0 = (filter *)0x1;
  }
  in_RDI[2] = in_stack_ffffffffffffffc0;
  iVar1 = knote_copyout_flag_actions(in_stack_ffffffffffffffc0,kn);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
evfilt_timer_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    struct epoll_event * const ev = (struct epoll_event *) ptr;
    uint64_t expired;
    ssize_t n;

    memcpy(dst, &src->kev, sizeof(*dst));
    if (ev->events & EPOLLERR)
        dst->fflags = 1; /* FIXME: Return the actual timer error */

    /* On return, data contains the number of times the
       timer has been trigered.
     */
    n = read(src->kn_timerfd, &expired, sizeof(expired));
    if (n != sizeof(expired)) {
        dbg_puts("invalid read from timerfd");
        expired = 1;  /* Fail gracefully */
    }
    dst->data = expired;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}